

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O3

EC_KEY * d2i_ECParameters(EC_KEY **key,uchar **in,long len)

{
  int iVar1;
  EC_GROUP *group;
  EC_KEY *key_00;
  CBS cbs;
  CBS local_30;
  
  if (-1 < len) {
    local_30.data = *in;
    local_30.len = len;
    group = EC_KEY_parse_parameters(&local_30);
    if (group != (EC_GROUP *)0x0) {
      key_00 = EC_KEY_new();
      if ((key_00 != (EC_KEY *)0x0) &&
         (iVar1 = EC_KEY_set_group(key_00,(EC_GROUP *)group), iVar1 != 0)) {
        if (key != (EC_KEY **)0x0) {
          EC_KEY_free(*key);
          *key = key_00;
        }
        *in = local_30.data;
        return key_00;
      }
      EC_KEY_free(key_00);
    }
  }
  return (EC_KEY *)0x0;
}

Assistant:

EC_KEY *d2i_ECParameters(EC_KEY **out_key, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  const EC_GROUP *group = EC_KEY_parse_parameters(&cbs);
  if (group == NULL) {
    return NULL;
  }

  EC_KEY *ret = EC_KEY_new();
  if (ret == NULL || !EC_KEY_set_group(ret, group)) {
    EC_KEY_free(ret);
    return NULL;
  }

  if (out_key != NULL) {
    EC_KEY_free(*out_key);
    *out_key = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}